

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_unregistering_a_subject_makes_it_not_currently_subscribed_Test::
~SubjectSetRegisterTest_unregistering_a_subject_makes_it_not_currently_subscribed_Test
          (SubjectSetRegisterTest_unregistering_a_subject_makes_it_not_currently_subscribed_Test
           *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, unregistering_a_subject_makes_it_not_currently_subscribed)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_SUBJECT0, false);
    subject_register.Register(SS_SUBJECT1, false);
    subject_register.Register(SS_SUBJECT2, false);

    subject_register.Unregister(SS_SUBJECT0);
    subject_register.Unregister(SS_SUBJECT1);

    EXPECT_EQ(false, subject_register.IsCurrentlySubscribed(SS_SUBJECT0));
    EXPECT_EQ(false, subject_register.IsCurrentlySubscribed(SS_SUBJECT1));
    EXPECT_EQ(true, subject_register.IsCurrentlySubscribed(SS_SUBJECT2));

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    ASSERT_TRUE(message);
    std::vector<Subject> set_comparison = {SS_SUBJECT2};
    EXPECT_EQ(set_comparison, message->GetSubjects());
}